

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.c
# Opt level: O0

int lys_print_clb(_func_ssize_t_void_ptr_void_ptr_size_t *writeclb,void *arg,lys_module *module,
                 LYS_OUTFORMAT format,char *target_node)

{
  LY_ERR *pLVar1;
  undefined1 local_58 [8];
  lyout out;
  char *target_node_local;
  LYS_OUTFORMAT format_local;
  lys_module *module_local;
  void *arg_local;
  _func_ssize_t_void_ptr_void_ptr_size_t *writeclb_local;
  
  out.method.mem.size = (size_t)target_node;
  if ((writeclb == (_func_ssize_t_void_ptr_void_ptr_size_t *)0x0) || (module == (lys_module *)0x0))
  {
    pLVar1 = ly_errno_location();
    *pLVar1 = LY_EINVAL;
    writeclb_local._4_4_ = 1;
  }
  else {
    local_58._0_4_ = LYOUT_CALLBACK;
    out._0_8_ = writeclb;
    out.method.f = (FILE *)arg;
    writeclb_local._4_4_ = lys_print_((lyout *)local_58,module,format,target_node);
  }
  return writeclb_local._4_4_;
}

Assistant:

API int
lys_print_clb(ssize_t (*writeclb)(void *arg, const void *buf, size_t count), void *arg, const struct lys_module *module, LYS_OUTFORMAT format, const char *target_node)
{
    struct lyout out;

    if (!writeclb || !module) {
        ly_errno = LY_EINVAL;
        return EXIT_FAILURE;
    }

    out.type = LYOUT_CALLBACK;
    out.method.clb.f = writeclb;
    out.method.clb.arg = arg;

    return lys_print_(&out, module, format, target_node);
}